

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

string * cmSystemTools::TrimWhitespace(string *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  char *pcVar2;
  char *pcVar3;
  allocator local_9;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar1 = s->_M_string_length;
  pcVar3 = pcVar2;
  do {
    if (sVar1 == 0) {
LAB_0035908e:
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
      return __return_storage_ptr__;
    }
    if (' ' < *pcVar3) {
      if (sVar1 != 0) {
        pcVar2 = pcVar2 + s->_M_string_length + 1;
        do {
          pcVar3 = pcVar2 + -2;
          pcVar2 = pcVar2 + -1;
        } while (*pcVar3 < '!');
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      goto LAB_0035908e;
    }
    pcVar3 = pcVar3 + 1;
    sVar1 = sVar1 - 1;
  } while( true );
}

Assistant:

std::string cmSystemTools::TrimWhitespace(const std::string& s)
{
  std::string::const_iterator start = s.begin();
  while(start != s.end() && *start <= ' ')
    ++start;
  if (start == s.end())
    return "";

  std::string::const_iterator stop = s.end()-1;
  while(*stop <= ' ')
    --stop;
  return std::string(start, stop+1);
}